

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall mario::Connector::connecting(Connector *this,int sockfd)

{
  Channel *this_00;
  pointer pCVar1;
  Connector *local_c8;
  code *local_c0;
  undefined8 local_b8;
  type local_b0;
  EventCallback local_98;
  Connector *local_78;
  code *local_70;
  undefined8 local_68;
  type local_60;
  EventCallback local_48;
  int local_14;
  Connector *pCStack_10;
  int sockfd_local;
  Connector *this_local;
  
  local_14 = sockfd;
  pCStack_10 = this;
  setState(this,kConnecting);
  this_00 = (Channel *)operator_new(0xa0);
  Channel::Channel(this_00,this->_loop,local_14);
  std::unique_ptr<mario::Channel,_std::default_delete<mario::Channel>_>::reset
            (&this->_channel,this_00);
  pCVar1 = std::unique_ptr<mario::Channel,_std::default_delete<mario::Channel>_>::operator->
                     (&this->_channel);
  local_70 = handleWrite;
  local_68 = 0;
  local_78 = this;
  std::bind<void(mario::Connector::*)(),mario::Connector*>
            (&local_60,(offset_in_Connector_to_subr *)&local_70,&local_78);
  std::function<void()>::function<std::_Bind<void(mario::Connector::*(mario::Connector*))()>,void>
            ((function<void()> *)&local_48,&local_60);
  Channel::setWriteCallback(pCVar1,&local_48);
  std::function<void_()>::~function(&local_48);
  pCVar1 = std::unique_ptr<mario::Channel,_std::default_delete<mario::Channel>_>::operator->
                     (&this->_channel);
  local_c0 = handleError;
  local_b8 = 0;
  local_c8 = this;
  std::bind<void(mario::Connector::*)(),mario::Connector*>
            (&local_b0,(offset_in_Connector_to_subr *)&local_c0,&local_c8);
  std::function<void()>::function<std::_Bind<void(mario::Connector::*(mario::Connector*))()>,void>
            ((function<void()> *)&local_98,&local_b0);
  Channel::setErrorCallback(pCVar1,&local_98);
  std::function<void_()>::~function(&local_98);
  pCVar1 = std::unique_ptr<mario::Channel,_std::default_delete<mario::Channel>_>::operator->
                     (&this->_channel);
  Channel::enableWriting(pCVar1);
  return;
}

Assistant:

void Connector::connecting(int sockfd) {
    setState(kConnecting);
    _channel.reset(new Channel(_loop, sockfd));
    _channel->setWriteCallback(
            std::bind(&Connector::handleWrite, this)
            );
    _channel->setErrorCallback(
            std::bind(&Connector::handleError, this)
            );
    _channel->enableWriting();
}